

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_0::CWriter::WriteTailCallAsserts(CWriter *this,FuncSignature *sig)

{
  bool bVar1;
  size_type sVar2;
  Newline local_1a;
  Newline local_19;
  FuncSignature *local_18;
  FuncSignature *sig_local;
  CWriter *this_local;
  
  local_18 = sig;
  sig_local = (FuncSignature *)this;
  sVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(&sig->param_types);
  if (sVar2 != 0) {
    (anonymous_namespace)::CWriter::
    Write<char_const(&)[22],std::vector<wabt::Type,std::allocator<wabt::Type>>const&,char_const(&)[6],unsigned_int_const&,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [22])"static_assert(sizeof(",&local_18->param_types,
               (char (*) [6])") <= ",&(anonymous_namespace)::kTailCallStackSize,
               (char (*) [3])0x37d78e,&local_19);
  }
  sVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(&local_18->result_types);
  if ((sVar2 != 0) &&
     (bVar1 = std::operator!=(&local_18->result_types,&local_18->param_types), bVar1)) {
    (anonymous_namespace)::CWriter::
    Write<char_const(&)[22],std::vector<wabt::Type,std::allocator<wabt::Type>>const&,char_const(&)[6],unsigned_int_const&,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [22])"static_assert(sizeof(",&local_18->result_types,
               (char (*) [6])") <= ",&(anonymous_namespace)::kTailCallStackSize,
               (char (*) [3])0x37d78e,&local_1a);
  }
  return;
}

Assistant:

void CWriter::WriteTailCallAsserts(const FuncSignature& sig) {
  if (sig.param_types.size()) {
    Write("static_assert(sizeof(", sig.param_types, ") <= ", kTailCallStackSize,
          ");", Newline());
  }
  if (sig.result_types.size() && sig.result_types != sig.param_types) {
    Write("static_assert(sizeof(", sig.result_types,
          ") <= ", kTailCallStackSize, ");", Newline());
  }
}